

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::QueryCase::iterate(QueryCase *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  float *pfVar5;
  size_type sVar6;
  reference bbox;
  float fVar7;
  float minY;
  float minZ;
  float minW;
  float maxX;
  float maxY;
  float maxZ;
  float maxW;
  BoundingBox *boundingBox_1;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0;
  ScopedLogSection local_b0;
  ScopedLogSection section;
  int local_a0;
  int caseNdx;
  int coordNdx;
  BoundingBox boundingBox;
  int ndx;
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>_>
  local_70;
  const_iterator local_68;
  undefined1 local_60 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  cases;
  Random rnd;
  CallLogWrapper gl;
  int numRandomCases;
  QueryCase *this_local;
  
  if (Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases == '\0') {
    iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases
                               );
    if (iVar2 != 0) {
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[0].min,0.0,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[0].max,0.0,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[1].min,-0.0,-0.0,-0.0,-0.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[1].max,0.0,0.0,0.0,-0.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[2].min,0.0,0.0,0.0,0.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[2].max,1.0,1.0,1.0,-1.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[3].min,2.0,2.0,2.0,2.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[3].max,1.5,1.5,1.5,1.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[4].min,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[4].max,-1.0,-1.0,-1.0,-1.0);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[5].min,1.0,1.0,1.0,0.3);
      tcu::Vector<float,_4>::Vector(&iterate::fixedCases[5].max,-1.0,-1.0,-1.0,-1.2);
      __cxa_guard_release(&Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases);
    }
  }
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&rnd.m_rnd.z,(Functions *)CONCAT44(extraout_var,iVar2),pTVar4);
  de::Random::Random((Random *)
                     &cases.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0xde3210);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
            *)local_60);
  local_70._M_current =
       (BoundingBox *)
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
       ::begin((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                *)local_60);
  __gnu_cxx::
  __normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>>>
  ::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox*>
            ((__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>>>
              *)&local_68,&local_70);
  register0x00000000 =
       std::
       vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>>
       ::insert<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox_const*,void>
                 ((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>>
                   *)local_60,local_68,iterate::fixedCases,
                  (BoundingBox *)
                  &Functional::(anonymous_namespace)::QueryCase::iterate()::fixedCases);
  for (boundingBox.max.m_data[2] = 0.0; (int)boundingBox.max.m_data[2] < 9;
      boundingBox.max.m_data[2] = (float)((int)boundingBox.max.m_data[2] + 1)) {
    BoundingBox::BoundingBox((BoundingBox *)&caseNdx);
    for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
      fVar7 = de::Random::getFloat
                        ((Random *)
                         &cases.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,-4.0,4.0);
      pfVar5 = BoundingBox::getComponentAccess((BoundingBox *)&caseNdx,local_a0);
      *pfVar5 = fVar7;
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                 *)local_60,(value_type *)&caseNdx);
  }
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&rnd.m_rnd.z,true);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  section.m_log._4_4_ = 0;
  while( true ) {
    iVar2 = section.m_log._4_4_;
    sVar6 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                    *)local_60);
    if ((int)sVar6 <= iVar2) break;
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Iteration",&local_d1);
    boundingBox_1._4_4_ = section.m_log._4_4_ + 1;
    de::toString<int>(&local_118,(int *)((long)&boundingBox_1 + 4));
    std::operator+(&local_f8,"Iteration ",&local_118);
    tcu::ScopedLogSection::ScopedLogSection(&local_b0,pTVar4,&local_d0,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    bbox = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
           ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                         *)local_60,(long)section.m_log._4_4_);
    fVar7 = tcu::Vector<float,_4>::x(&bbox->min);
    minY = tcu::Vector<float,_4>::y(&bbox->min);
    minZ = tcu::Vector<float,_4>::z(&bbox->min);
    minW = tcu::Vector<float,_4>::w(&bbox->min);
    maxX = tcu::Vector<float,_4>::x(&bbox->max);
    maxY = tcu::Vector<float,_4>::y(&bbox->max);
    maxZ = tcu::Vector<float,_4>::z(&bbox->max);
    maxW = tcu::Vector<float,_4>::w(&bbox->max);
    glu::CallLogWrapper::glPrimitiveBoundingBox
              ((CallLogWrapper *)&rnd.m_rnd.z,fVar7,minY,minZ,minW,maxX,maxY,maxZ,maxW);
    bVar1 = verifyState(this,(CallLogWrapper *)&rnd.m_rnd.z,bbox);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Unexpected query result");
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_b0);
    section.m_log._4_4_ = section.m_log._4_4_ + 1;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
             *)local_60);
  de::Random::~Random((Random *)
                      &cases.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BoundingBox>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&rnd.m_rnd.z);
  return STOP;
}

Assistant:

QueryCase::IterateResult QueryCase::iterate (void)
{
	static const BoundingBox fixedCases[] =
	{
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f) },
		{ tcu::Vec4(-0.0f, -0.0f, -0.0f, -0.0f), tcu::Vec4( 0.0f,  0.0f,  0.0f, -0.0f) },
		{ tcu::Vec4( 0.0f,  0.0f,  0.0f,  0.0f), tcu::Vec4( 1.0f,  1.0f,  1.0f, -1.0f) },
		{ tcu::Vec4( 2.0f,  2.0f,  2.0f,  2.0f), tcu::Vec4( 1.5f,  1.5f,  1.5f,  1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  1.0f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f) },
		{ tcu::Vec4( 1.0f,  1.0f,  1.0f,  0.3f), tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.2f) },
	};

	const int					numRandomCases	= 9;
	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	de::Random					rnd				(0xDE3210);
	std::vector<BoundingBox>	cases;

	cases.insert(cases.begin(), DE_ARRAY_BEGIN(fixedCases), DE_ARRAY_END(fixedCases));
	for (int ndx = 0; ndx < numRandomCases; ++ndx)
	{
		BoundingBox	boundingBox;

		// parameter evaluation order is not guaranteed, cannot just do "max = (rand(), rand(), ...)
		for (int coordNdx = 0; coordNdx < 8; ++coordNdx)
			boundingBox.getComponentAccess(coordNdx) = rnd.getFloat(-4.0f, 4.0f);

		cases.push_back(boundingBox);
	}

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int caseNdx = 0; caseNdx < (int)cases.size(); ++caseNdx)
	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Iteration", "Iteration " + de::toString(caseNdx+1));
		const BoundingBox&			boundingBox	= cases[caseNdx];

		gl.glPrimitiveBoundingBox(boundingBox.min.x(), boundingBox.min.y(), boundingBox.min.z(), boundingBox.min.w(),
								  boundingBox.max.x(), boundingBox.max.y(), boundingBox.max.z(), boundingBox.max.w());

		if (!verifyState(gl, boundingBox))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected query result");
	}

	return STOP;
}